

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProximityContainerMeshless.cpp
# Opt level: O3

void __thiscall
chrono::ChProximityContainerMeshless::AccumulateStep1(ChProximityContainerMeshless *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long lVar11;
  long *plVar12;
  long *plVar13;
  _List_node_base *p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar31;
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ChVectorN<double,_3> mdist;
  double local_128;
  double local_118;
  double local_100;
  double local_f8;
  double dStack_f0;
  size_t local_e8;
  undefined1 *local_e0;
  double *local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  undefined1 local_a8 [16];
  double local_98;
  undefined1 local_88 [16];
  long local_78;
  long lStack_70;
  undefined1 local_68 [16];
  long local_58;
  long lStack_50;
  undefined1 local_48 [24];
  
  p_Var14 = (this->proximitylist).
            super__List_base<chrono::ChProximityMeshless_*,_std::allocator<chrono::ChProximityMeshless_*>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var14 != (_List_node_base *)&this->proximitylist) {
    local_d8 = &local_100;
    local_e0 = local_a8;
    local_e8 = 0x18;
    do {
      lVar11 = (**(code **)((long)(p_Var14[1]._M_next)->_M_next + 0x18))();
      if (*(long *)(lVar11 + 0x10) == 0) {
        plVar12 = (long *)0x0;
      }
      else {
        plVar12 = (long *)__dynamic_cast(*(long *)(lVar11 + 0x10),&ChContactable::typeinfo,
                                         &fea::ChNodeMeshless::typeinfo,0x50);
      }
      lVar11 = (**(code **)((long)(p_Var14[1]._M_next)->_M_next + 0x20))();
      if (*(long *)(lVar11 + 0x10) == 0) {
        plVar13 = (long *)0x0;
      }
      else {
        plVar13 = (long *)__dynamic_cast(*(long *)(lVar11 + 0x10),&ChContactable::typeinfo,
                                         &fea::ChNodeMeshless::typeinfo,0x50);
      }
      local_c8 = (double)plVar13[3];
      local_78 = plVar13[1];
      lStack_70 = plVar13[2];
      local_b8 = (double)plVar12[3];
      local_d0 = (double)plVar13[0x11];
      local_58 = plVar12[1];
      lStack_50 = plVar12[2];
      local_88 = *(undefined1 (*) [16])(plVar13 + 0xf);
      local_c0 = (double)plVar12[0x11];
      local_68 = *(undefined1 (*) [16])(plVar12 + 0xf);
      local_b0 = local_d0 - local_c0;
      local_a8 = vsubpd_avx(local_88,local_68);
      auVar16._0_8_ = local_a8._0_8_ * local_a8._0_8_;
      auVar16._8_8_ = local_a8._8_8_ * local_a8._8_8_;
      auVar16 = vshufpd_avx(auVar16,auVar16,1);
      auVar16 = vfmadd231sd_fma(auVar16,local_a8,local_a8);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_b0;
      auVar16 = vfmadd231sd_fma(auVar16,auVar25,auVar25);
      dVar1 = (double)plVar12[0x55];
      auVar16 = vsqrtsd_avx(auVar16,auVar16);
      local_128 = 0.0;
      local_118 = 0.0;
      dVar22 = auVar16._0_8_;
      local_98 = local_b0;
      local_48._0_16_ = local_a8;
      if (dVar22 < dVar1) {
        dVar20 = pow(dVar1,9.0);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = dVar1;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = dVar22 * dVar22;
        auVar16 = vfmsub231sd_fma(auVar15,auVar23,auVar23);
        local_118 = pow(auVar16._0_8_,3.0);
        local_118 = local_118 * (315.0 / (dVar20 * 201.06192982974676));
      }
      dVar1 = (double)plVar13[0x55];
      if (dVar22 < dVar1) {
        dVar20 = pow(dVar1,9.0);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = dVar1;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dVar22 * dVar22;
        auVar16 = vfmsub231sd_fma(auVar21,auVar24,auVar24);
        local_128 = pow(auVar16._0_8_,3.0);
        local_128 = local_128 * (315.0 / (dVar20 * 201.06192982974676));
      }
      auVar17._0_8_ = (**(code **)(*plVar13 + 0x90))(plVar13);
      auVar17._8_56_ = extraout_var;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_118;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = plVar12[0x54];
      auVar16 = vfmadd213sd_fma(auVar17._0_16_,auVar7,auVar2);
      plVar12[0x54] = auVar16._0_8_;
      auVar19._0_8_ = (**(code **)(*plVar12 + 0x90))(plVar12);
      auVar19._8_56_ = extraout_var_00;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_128;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = plVar13[0x54];
      auVar16 = vfmadd213sd_fma(auVar19._0_16_,auVar6,auVar3);
      plVar13[0x54] = auVar16._0_8_;
      memcpy(local_d8,local_e0,local_e8);
      auVar9._8_8_ = lStack_70;
      auVar9._0_8_ = local_78;
      auVar8._8_8_ = dStack_f0;
      auVar8._0_8_ = local_f8;
      auVar10._8_8_ = lStack_50;
      auVar10._0_8_ = local_58;
      auVar16 = vsubpd_avx(auVar9,local_88);
      auVar25 = vsubpd_avx(auVar10,local_68);
      auVar34._8_8_ = local_128;
      auVar34._0_8_ = local_128;
      dVar22 = (local_c8 - local_d0) - (local_b8 - local_c0);
      vsubpd_avx(auVar16,auVar25);
      dVar1 = local_100 * dStack_f0;
      auVar4._8_8_ = local_f8;
      auVar4._0_8_ = local_f8;
      auVar15 = vmulpd_avx512vl(auVar8,auVar4);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_100 * local_100;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_100 * local_f8;
      auVar16 = vunpcklpd_avx(auVar28,auVar32);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar1;
      auVar25 = vunpcklpd_avx(auVar26,auVar32);
      dVar31 = auVar15._8_8_;
      plVar12[0x12] = (long)(local_118 * auVar16._0_8_ + (double)plVar12[0x12]);
      plVar12[0x13] = (long)(local_118 * auVar16._8_8_ + (double)plVar12[0x13]);
      plVar12[0x14] = (long)(local_118 * auVar25._0_8_ + (double)plVar12[0x14]);
      plVar12[0x15] = (long)(local_118 * auVar25._8_8_ + (double)plVar12[0x15]);
      plVar12[0x16] = (long)(local_118 * auVar15._0_8_ + (double)plVar12[0x16]);
      plVar12[0x17] = (long)(local_118 * dVar31 + (double)plVar12[0x17]);
      plVar12[0x18] = (long)(local_118 * dVar1 + (double)plVar12[0x18]);
      plVar12[0x19] = (long)(local_118 * dVar31 + (double)plVar12[0x19]);
      plVar12[0x1a] = (long)(local_118 * dStack_f0 * dStack_f0 + (double)plVar12[0x1a]);
      auVar19 = _DAT_0096f040;
      plVar13[0x12] = (long)(local_128 * auVar16._0_8_ + (double)plVar13[0x12]);
      plVar13[0x13] = (long)(local_128 * auVar16._8_8_ + (double)plVar13[0x13]);
      plVar13[0x14] = (long)(local_128 * auVar25._0_8_ + (double)plVar13[0x14]);
      plVar13[0x15] = (long)(local_128 * auVar25._8_8_ + (double)plVar13[0x15]);
      auVar5._8_8_ = 0x8000000000000000;
      auVar5._0_8_ = 0x8000000000000000;
      auVar16 = vxorpd_avx512vl(auVar34,auVar5);
      dVar20 = auVar16._0_8_;
      plVar13[0x16] = (long)(local_128 * auVar15._0_8_ + (double)plVar13[0x16]);
      plVar13[0x17] = (long)(local_128 * dVar31 + (double)plVar13[0x17]);
      plVar13[0x18] = (long)(local_128 * dVar1 + (double)plVar13[0x18]);
      plVar13[0x19] = (long)(local_128 * dVar31 + (double)plVar13[0x19]);
      auVar17 = _DAT_0096f000;
      auVar33._0_8_ = (double)local_48._0_8_ * dVar20;
      auVar33._8_8_ = (double)local_48._8_8_ * dVar20;
      plVar13[0x1a] = (long)(local_128 * dStack_f0 * dStack_f0 + (double)plVar13[0x1a]);
      auVar27._0_8_ = (double)local_48._0_8_ * local_118;
      auVar27._8_8_ = (double)local_48._8_8_ * local_118;
      vinsertf32x4_avx512f(ZEXT1664(auVar27),auVar27,1);
      auVar17 = vpermt2pd_avx512f(auVar17,ZEXT3264(CONCAT824(dVar22,CONCAT816(dVar22,CONCAT88(dVar22
                                                  ,dVar22)))));
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_b0 * local_118;
      auVar18 = vbroadcastsd_avx512f(auVar29);
      auVar18 = vpermt2pd_avx512f(auVar19,auVar18);
      vinsertf32x4_avx512f(ZEXT1664(auVar33),auVar33,1);
      auVar18 = vmulpd_avx512f(auVar17,auVar18);
      auVar18 = vaddpd_avx512f(auVar18,*(undefined1 (*) [64])(plVar12 + 0x1b));
      *(undefined1 (*) [64])(plVar12 + 0x1b) = auVar18;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_b0 * dVar20;
      auVar18 = vbroadcastsd_avx512f(auVar30);
      auVar19 = vpermt2pd_avx512f(auVar19,auVar18);
      auVar17 = vmulpd_avx512f(auVar17,auVar19);
      plVar12[0x23] = (long)(dVar22 * local_b0 * local_118 + (double)plVar12[0x23]);
      auVar17 = vsubpd_avx512f(*(undefined1 (*) [64])(plVar13 + 0x1b),auVar17);
      *(undefined1 (*) [64])(plVar13 + 0x1b) = auVar17;
      plVar13[0x23] = (long)((double)plVar13[0x23] - dVar22 * local_b0 * dVar20);
      p_Var14 = p_Var14->_M_next;
    } while (p_Var14 != (_List_node_base *)&this->proximitylist);
  }
  return;
}

Assistant:

void ChProximityContainerMeshless::AccumulateStep1() {
    // Per-edge data computation
    std::list<ChProximityMeshless*>::iterator iterproximity = proximitylist.begin();
    while (iterproximity != proximitylist.end()) {
        ChNodeMeshless* mnodeA = dynamic_cast<ChNodeMeshless*>((*iterproximity)->GetModelA()->GetContactable());
        ChNodeMeshless* mnodeB = dynamic_cast<ChNodeMeshless*>((*iterproximity)->GetModelB()->GetContactable());

        ChVector<> x_A = mnodeA->GetPos();
        ChVector<> x_B = mnodeB->GetPos();
        ChVector<> x_Aref = mnodeA->GetPosReference();
        ChVector<> x_Bref = mnodeB->GetPosReference();
        ChVector<> u_A = (x_A - x_Aref);
        ChVector<> u_B = (x_B - x_Bref);

        ChVector<> d_BA = x_Bref - x_Aref;
        ChVector<> g_BA = u_B - u_A;
        double dist_BA = d_BA.Length();
        double W_BA = W_sph(dist_BA, mnodeA->GetKernelRadius());
        double W_AB = W_sph(dist_BA, mnodeB->GetKernelRadius());

        // increment data of connected nodes

        mnodeA->density += mnodeB->GetMass() * W_BA;
        mnodeB->density += mnodeA->GetMass() * W_AB;

        ChVectorN<double, 3> mdist;
        mdist.segment(0,3) = d_BA.eigen();
        
        ChMatrix33<> ddBA = mdist * mdist.transpose();        
        ChMatrix33<> ddAB(ddBA);

        mnodeA->Amoment += W_BA * ddBA;  // increment the moment matrix: Aa += d_BA*d_BA'*W_BA
        mnodeB->Amoment += W_AB * ddAB;  // increment the moment matrix: Ab += d_AB*d_AB'*W_AB

        ChVector<> m_inc_BA = W_BA * d_BA;
        ChVector<> m_inc_AB = -W_AB * d_BA;

        // increment the J matrix
        mnodeA->J.col(0) += g_BA.x() * m_inc_BA.eigen();
        mnodeA->J.col(1) += g_BA.y() * m_inc_BA.eigen();
        mnodeA->J.col(2) += g_BA.z() * m_inc_BA.eigen();

        // increment the J matrix
        mnodeB->J.col(0) -= g_BA.x() * m_inc_AB.eigen();
        mnodeB->J.col(1) -= g_BA.y() * m_inc_AB.eigen();
        mnodeB->J.col(2) -= g_BA.z() * m_inc_AB.eigen();

        ++iterproximity;
    }
}